

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O3

SmallBuffer *
helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,string_view str,double val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  json_value jVar3;
  _Alloc_hider __src;
  string *val_00;
  reference pvVar4;
  helics *this;
  undefined4 in_register_00000034;
  char *in_R8;
  string_view val_01;
  string_view pointName;
  complex<double> cval;
  json json;
  NamedPoint local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  double local_68;
  double local_60;
  data local_58;
  data local_48;
  data local_38;
  
  val_01._M_len = str._M_str;
  this = (helics *)str._M_len;
  local_60 = val;
  if (type == HELICS_NAMED_POINT) {
    local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
    local_68 = val;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,val_01._M_len,this + (long)val_01._M_len);
    local_a0.value = local_68;
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_a0);
LAB_00292ec5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.name._M_dataplus._M_p == &local_a0.name.field_2) {
      return __return_storage_ptr__;
    }
LAB_00292ecf:
    operator_delete(local_a0.name._M_dataplus._M_p,local_a0.name.field_2._M_allocated_capacity + 1);
  }
  else {
    if (NAN(val)) {
      val_01._M_str = in_R8;
      typeConvert(__return_storage_ptr__,(helics *)CONCAT44(in_register_00000034,type),
                  (DataType)str._M_len,val_01);
      return __return_storage_ptr__;
    }
    switch(type) {
    case HELICS_STRING:
    case HELICS_CHAR:
      pointName._M_str = (char *)&switchD_00292f0f::switchdataD_004420b0;
      pointName._M_len = (size_t)val_01._M_len;
      helicsNamedPointString_abi_cxx11_(&local_a0.name,this,pointName,val);
      local_78._M_len = local_a0.name._M_string_length;
      local_78._M_str = local_a0.name._M_dataplus._M_p;
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                (__return_storage_ptr__,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.name._M_dataplus._M_p == &local_a0.name.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00292ecf;
    case HELICS_DOUBLE:
      ValueConverter<double>::convert(__return_storage_ptr__,&local_60);
      break;
    case HELICS_INT:
    case HELICS_TIME:
      local_a0.name._M_dataplus._M_p = (pointer)(long)val;
      ValueConverter<long>::convert(__return_storage_ptr__,(long *)&local_a0);
      break;
    case HELICS_COMPLEX:
      local_a0.name._M_string_length = 0;
      local_a0.name._M_dataplus._M_p = (pointer)val;
      ValueConverter<std::complex<double>_>::convert
                (__return_storage_ptr__,(complex<double> *)&local_a0);
      break;
    case HELICS_VECTOR:
      ValueConverter<double>::convert(__return_storage_ptr__,&local_60,1);
      break;
    case HELICS_COMPLEX_VECTOR:
      local_a0.name._M_string_length = 0;
      local_a0.name._M_dataplus._M_p = (pointer)val;
      ValueConverter<std::complex<double>_>::convert
                (__return_storage_ptr__,(complex<double> *)&local_a0,1);
      break;
    case HELICS_BOOL:
      local_a0.name._M_string_length = 0x456c12;
      if (val != 0.0) {
        local_a0.name._M_string_length = 0x45e2f3;
      }
      if (NAN(val)) {
        local_a0.name._M_string_length = 0x45e2f3;
      }
      local_a0.name._M_string_length = local_a0.name._M_string_length + 1;
      local_a0.name._M_dataplus._M_p = (pointer)0x1;
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                (__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_a0);
      break;
    default:
      if (type == HELICS_JSON) {
        local_78._M_len = local_78._M_len & 0xffffffffffffff00;
        local_78._M_str = (char *)0x0;
        val_00 = typeNameStringRef_abi_cxx11_(HELICS_NAMED_POINT);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00);
        pvVar4 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&local_78,"type");
        vVar2 = (pvVar4->m_data).m_type;
        (pvVar4->m_data).m_type = local_38.m_type;
        jVar3 = (pvVar4->m_data).m_value;
        (pvVar4->m_data).m_value = local_38.m_value;
        local_38.m_type = vVar2;
        local_38.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_38);
        paVar1 = &local_a0.name.field_2;
        local_a0.name._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,val_01._M_len,this + (long)val_01._M_len);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_48,&local_a0.name);
        pvVar4 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&local_78,"name");
        vVar2 = (pvVar4->m_data).m_type;
        (pvVar4->m_data).m_type = local_48.m_type;
        jVar3 = (pvVar4->m_data).m_value;
        (pvVar4->m_data).m_value = local_48.m_value;
        local_48.m_type = vVar2;
        local_48.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0.name._M_dataplus._M_p,
                          local_a0.name.field_2._M_allocated_capacity + 1);
        }
        local_58.m_type = null;
        local_58._1_7_ = 0;
        local_58.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_58,local_60);
        pvVar4 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&local_78,"value");
        vVar2 = (pvVar4->m_data).m_type;
        (pvVar4->m_data).m_type = local_58.m_type;
        local_58.m_type = vVar2;
        jVar3 = (pvVar4->m_data).m_value;
        (pvVar4->m_data).m_value.object = (object_t *)local_58.m_value;
        local_58.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_58);
        fileops::generateJsonString(&local_a0.name,(json *)&local_78,true);
        __src._M_p = local_a0.name._M_dataplus._M_p;
        (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0] = 0;
        (__return_storage_ptr__->buffer)._M_elems[1] = 0;
        (__return_storage_ptr__->buffer)._M_elems[2] = 0;
        (__return_storage_ptr__->buffer)._M_elems[3] = 0;
        (__return_storage_ptr__->buffer)._M_elems[4] = 0;
        (__return_storage_ptr__->buffer)._M_elems[5] = 0;
        (__return_storage_ptr__->buffer)._M_elems[6] = 0;
        (__return_storage_ptr__->buffer)._M_elems[7] = 0;
        (__return_storage_ptr__->buffer)._M_elems[8] = 0;
        (__return_storage_ptr__->buffer)._M_elems[9] = 0;
        (__return_storage_ptr__->buffer)._M_elems[10] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
        (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
        __return_storage_ptr__->bufferSize = 0;
        __return_storage_ptr__->bufferCapacity = 0x40;
        __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
        __return_storage_ptr__->nonOwning = false;
        __return_storage_ptr__->locked = false;
        __return_storage_ptr__->usingAllocatedBuffer = false;
        __return_storage_ptr__->errorCondition = '\0';
        __return_storage_ptr__->userKey = 0;
        SmallBuffer::reserve(__return_storage_ptr__,local_a0.name._M_string_length);
        __return_storage_ptr__->bufferSize = local_a0.name._M_string_length;
        memcpy(__return_storage_ptr__->heap,__src._M_p,local_a0.name._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0.name._M_dataplus._M_p,
                          local_a0.name.field_2._M_allocated_capacity + 1);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_78);
        return __return_storage_ptr__;
      }
    case HELICS_NAMED_POINT:
      local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
      local_68 = val;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,val_01._M_len,this + (long)val_01._M_len);
      local_a0.value = local_68;
      ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_a0);
      goto LAB_00292ec5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, std::string_view str, double val)
{
    if (type == DataType::HELICS_NAMED_POINT) {
        return ValueConverter<NamedPoint>::convert(NamedPoint(str, val));
    }
    if (std::isnan(val)) {
        // just convert the string
        return typeConvert(type, str);
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(val);
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(val));
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(std::complex<double>(val, 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val != 0.0) ? "1" : "0");
        case DataType::HELICS_NAMED_POINT:
        default:
            return ValueConverter<NamedPoint>::convert(NamedPoint(str, val));
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(helicsNamedPointString(str, val));
        case DataType::HELICS_COMPLEX_VECTOR: {
            const std::complex<double> cval(val, 0.0);
            return ValueConverter<std::complex<double>>::convert(&cval, 1);
        }
        case DataType::HELICS_VECTOR:
            return ValueConverter<double>::convert(&(val), 1);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_NAMED_POINT);
            json["name"] = std::string(str);
            json["value"] = val;
            return fileops::generateJsonString(json);
        }
    }
}